

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

void tabplay_tilde_list(t_tabplay_tilde *x,t_symbol *s,int argc,t_atom *argv)

{
  t_float tVar1;
  long length;
  long start;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_tabplay_tilde *x_local;
  
  tVar1 = atom_getfloatarg(0,argc,argv);
  length = (long)tVar1;
  tVar1 = atom_getfloatarg(1,argc,argv);
  if (length < 0) {
    length = 0;
  }
  if ((long)tVar1 < 1) {
    x->x_limit = 0x7fffffff;
  }
  else {
    x->x_limit = (int)length + (int)(long)tVar1;
  }
  x->x_phase = (int)length;
  return;
}

Assistant:

static void tabplay_tilde_list(t_tabplay_tilde *x, t_symbol *s,
    int argc, t_atom *argv)
{
    long start = atom_getfloatarg(0, argc, argv);
    long length = atom_getfloatarg(1, argc, argv);
    if (start < 0) start = 0;
    if (length <= 0)
        x->x_limit = 0x7fffffff;
    else
        x->x_limit = (int)(start + length);
    x->x_phase = (int)start;
}